

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Node *pNVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  NodeType NVar8;
  Bool BVar9;
  int iVar10;
  Node *node;
  Node *pNVar11;
  Node **ppNVar12;
  int iVar13;
  
  pLVar2 = doc->lexer;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    iVar13 = 0;
    iVar5 = 0;
    do {
      pDVar3 = node->tag;
      if (pDVar3 == head->tag) {
        NVar8 = node->type;
        if (NVar8 == EndTag) {
          prvTidyFreeNode(doc,node);
          head->closed = yes;
          return;
        }
LAB_00141a69:
        if (NVar8 != StartTag) goto LAB_00141a93;
        goto LAB_00141a6e;
      }
      if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_HTML)) {
        NVar8 = node->type;
        goto LAB_00141a69;
      }
LAB_00141a93:
      BVar9 = prvTidynodeIsText(node);
      if (BVar9 != no) {
        if ((*(int *)((doc->config).value + 0x3b) != 0) || (*(int *)((doc->config).value + 6) == 1))
        goto LAB_00141c1f;
LAB_00141c0a:
        prvTidyReport(doc,head,node,0x27e);
LAB_00141c1f:
        prvTidyUngetToken(doc);
        return;
      }
      if ((node->type == ProcInsTag) &&
         ((node->element != (ctmbstr)0x0 &&
          (iVar10 = prvTidytmbstrcmp(node->element,"xml-stylesheet"), iVar10 == 0)))) {
        prvTidyReport(doc,head,node,0x27e);
        pNVar11 = prvTidyFindHTML(doc);
        pNVar4 = pNVar11->parent;
        node->parent = pNVar4;
        node->next = pNVar11;
        node->prev = pNVar11->prev;
        pNVar11->prev = node;
        if (node->prev != (Node *)0x0) {
          node->prev->next = node;
        }
        if (pNVar4->content == pNVar11) {
          pNVar4->content = node;
        }
      }
      else {
        BVar9 = InsertMisc(head,node);
        if (BVar9 == no) {
          if (node->type == DocTypeTag) {
            InsertDocType(doc,head,node);
          }
          else {
            if (node->tag != (Dict *)0x0) {
              if ((node->tag->model & 4) == 0) {
                if (pLVar2->isvoyager == no) goto LAB_00141c1f;
                goto LAB_00141c0a;
              }
              BVar9 = prvTidynodeIsElement(node);
              if (BVar9 != no) {
                if (node->tag != (Dict *)0x0) {
                  TVar1 = node->tag->id;
                  if (TVar1 == TidyTag_BASE) {
                    iVar6 = iVar13 + 1;
                    iVar7 = iVar5;
                    iVar10 = iVar13;
                  }
                  else {
                    if (TVar1 != TidyTag_TITLE) goto LAB_00141b56;
                    iVar6 = iVar13;
                    iVar7 = iVar5 + 1;
                    iVar10 = iVar5;
                  }
                  iVar5 = iVar7;
                  iVar13 = iVar6;
                  if (0 < iVar10) {
                    prvTidyReport(doc,head,node,0x27f);
                  }
                }
LAB_00141b56:
                node->parent = head;
                pNVar4 = head->last;
                node->prev = pNVar4;
                ppNVar12 = &pNVar4->next;
                if (pNVar4 == (Node *)0x0) {
                  ppNVar12 = &head->content;
                }
                *ppNVar12 = node;
                head->last = node;
                ParseTag(doc,node,IgnoreWhitespace);
                goto LAB_00141bce;
              }
            }
LAB_00141a6e:
            prvTidyReport(doc,head,node,0x235);
            prvTidyFreeNode(doc,node);
          }
        }
      }
LAB_00141bce:
      node = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(ParseHead)(TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;

    DEBUG_LOG(SPRTF("Enter ParseHead...\n"));
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseHead 1...\n"));
}